

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_hex_to_binary(char *hex,size_t hlen,void *data,size_t dlen)

{
  long lVar1;
  int8_t iVar2;
  byte bVar3;
  int *piVar4;
  ulong in_RCX;
  char *pcVar5;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  char *in_RDI;
  bool bVar6;
  int8_t cc;
  int8_t c2;
  int8_t c;
  size_t y;
  size_t n;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  char *local_10;
  
  lVar1 = CONCAT71(in_register_00000011,in_DL);
  local_28 = in_RCX;
  if (lVar1 == 0) {
    local_28 = 0xffffffffffffffff;
  }
  local_30 = 0;
  local_38 = 0;
  local_10 = in_RDI;
  while( true ) {
    bVar6 = false;
    if ((local_30 < in_RSI) && (bVar6 = false, *local_10 != '\0')) {
      bVar6 = local_38 < local_28;
    }
    if (!bVar6) {
      return local_38;
    }
    pcVar5 = local_10 + 1;
    iVar2 = hex_to_char(*local_10);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      return 0;
    }
    local_10 = local_10 + 2;
    bVar3 = hex_to_char(*pcVar5);
    if (bVar3 == 0xff) break;
    if (lVar1 != 0) {
      *(byte *)(lVar1 + local_38) = iVar2 << 4 | bVar3 & 0xf;
    }
    local_38 = local_38 + 1;
    local_30 = local_30 + 2;
  }
  return 0;
}

Assistant:

size_t
zt_hex_to_binary(char *hex, size_t hlen, void *data, size_t dlen) {
    size_t n;
    size_t y = 0;

    if (data == NULL) {
        dlen = -1;
    }

    for (n = 0, y = 0; n < hlen && *hex != '\0' && y < dlen; n++) {
        int8_t c;
        int8_t c2;
        int8_t cc = 0;

        if ((c = hex_to_char(*hex++)) == -1) {
            errno = EINVAL;
            return 0;
        }

        if ((c2 = hex_to_char(*hex++)) == -1) {
            return 0;
        } else {
            n++;
        }

        cc = (c << 4) | (c2 & 0xF);

        if (data != NULL) {
            ((char *)data)[y] = (char)cc;
        }
        y++;
    }
    return y;
}